

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int xmlPythonFileClose(void *context)

{
  int iVar1;
  PyObject *local_28;
  PyObject *ret;
  PyObject *file;
  void *context_local;
  
  local_28 = (PyObject *)0x0;
  if (context == (void *)0x0) {
    context_local._4_4_ = -1;
  }
  else {
    iVar1 = PyObject_HasAttrString(context,"io_close");
    if (iVar1 == 0) {
      iVar1 = PyObject_HasAttrString(context,"flush");
      if (iVar1 != 0) {
        local_28 = (PyObject *)_PyObject_CallMethod_SizeT(context,"flush","()");
      }
    }
    else {
      local_28 = (PyObject *)_PyObject_CallMethod_SizeT(context,"io_close","()");
    }
    if (local_28 != (PyObject *)0x0) {
      _Py_DECREF(local_28);
    }
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlPythonFileClose (void * context) {
    PyObject *file, *ret = NULL;

    file = (PyObject *) context;
    if (file == NULL) return(-1);
    if (PyObject_HasAttrString(file, (char *) "io_close")) {
        ret = PyObject_CallMethod(file, (char *) "io_close", (char *) "()");
    } else if (PyObject_HasAttrString(file, (char *) "flush")) {
        ret = PyObject_CallMethod(file, (char *) "flush", (char *) "()");
    }
    if (ret != NULL) {
	Py_DECREF(ret);
    }
    return(0);
}